

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshotDiff.cpp
# Opt level: O0

void __thiscall efsw::DirectorySnapshotDiff::clear(DirectorySnapshotDiff *this)

{
  DirectorySnapshotDiff *this_local;
  
  std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::clear(&this->FilesCreated);
  std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::clear(&this->FilesModified);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
  ::clear(&this->FilesMoved);
  std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::clear(&this->FilesDeleted);
  std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::clear(&this->DirsCreated);
  std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::clear(&this->DirsModified);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
  ::clear(&this->DirsMoved);
  std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::clear(&this->DirsDeleted);
  return;
}

Assistant:

void DirectorySnapshotDiff::clear() {
	FilesCreated.clear();
	FilesModified.clear();
	FilesMoved.clear();
	FilesDeleted.clear();
	DirsCreated.clear();
	DirsModified.clear();
	DirsMoved.clear();
	DirsDeleted.clear();
}